

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_Indices_Test<unsigned_short>::SparseArray_Indices_Test
          (SparseArray_Indices_Test<unsigned_short> *this)

{
  SparseArray_Indices_Test<unsigned_short> *this_local;
  
  anon_unknown.dwarf_92f3e::SparseArray<unsigned_short>::SparseArray
            (&this->super_SparseArray<unsigned_short>);
  (this->super_SparseArray<unsigned_short>).super_Test._vptr_Test =
       (_func_int **)&PTR__SparseArray_Indices_Test_00353ee0;
  return;
}

Assistant:

TYPED_TEST (SparseArray, Indices) {
    std::set<std::size_t> indices{2, 3, 5, 7};
    auto arr =
        sparse_array<int, TypeParam>::make_unique (std::begin (indices), std::end (indices), {});

    typename sparse_array<int, TypeParam>::indices idc{*arr};
    std::vector<std::size_t> actual;
    std::copy (std::begin (idc), std::end (idc), std::back_inserter (actual));
    std::vector<std::size_t> const expected{2, 3, 5, 7};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));
}